

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callingconvetion.cpp
# Opt level: O0

void __thiscall
stackjit::CallingConvention::handleReturnValue
          (CallingConvention *this,FunctionCompilationData *functionData,
          FunctionDefinition *funcToCall)

{
  Amd64Assembler this_00;
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *parameters;
  Type *pTVar2;
  IntRegister local_4c;
  IntRegister local_47;
  IntRegister local_44;
  IntRegister local_3f;
  int local_3c;
  int numStackArgs;
  Amd64Assembler assembler;
  OperandStack *operandStack;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *generatedCode;
  FunctionDefinition *funcToCall_local;
  FunctionCompilationData *functionData_local;
  CallingConvention *this_local;
  
  data = ManagedFunction::generatedCode(functionData->function);
  assembler.mData =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&functionData->operandStack;
  Amd64Assembler::Amd64Assembler((Amd64Assembler *)&stack0xffffffffffffffc8,data);
  parameters = FunctionDefinition::parameters(funcToCall);
  local_3c = anon_unknown_4::numStackArguments(parameters);
  if (0 < local_3c) {
    IntRegister::IntRegister(&local_3f,SP);
    local_44.mExtendedRegister = local_3f.mExtendedRegister;
    local_44.mIsBase = local_3f.mIsBase;
    local_44.mBaseRegister = local_3f.mBaseRegister;
    Amd64Assembler::add((Amd64Assembler *)&stack0xffffffffffffffc8,local_44,local_3c << 3,false);
  }
  pTVar2 = FunctionDefinition::returnType(funcToCall);
  bVar1 = TypeSystem::isPrimitiveType(pTVar2,Void);
  if (!bVar1) {
    pTVar2 = FunctionDefinition::returnType(funcToCall);
    bVar1 = TypeSystem::isPrimitiveType(pTVar2,Float);
    this_00 = assembler;
    if (bVar1) {
      OperandStack::pushReg((OperandStack *)assembler.mData,XMM0);
    }
    else {
      IntRegister::IntRegister(&local_47,AX);
      local_4c.mExtendedRegister = local_47.mExtendedRegister;
      local_4c.mIsBase = local_47.mIsBase;
      local_4c.mBaseRegister = local_47.mBaseRegister;
      OperandStack::pushReg((OperandStack *)this_00.mData,local_4c);
    }
  }
  return;
}

Assistant:

void CallingConvention::handleReturnValue(FunctionCompilationData& functionData, const FunctionDefinition& funcToCall) const {
		auto& generatedCode = functionData.function.generatedCode();
		auto& operandStack = functionData.operandStack;
		Amd64Assembler assembler(generatedCode);

		//If we have passed arguments via the stack, adjust the stack pointer.
		int numStackArgs = numStackArguments(funcToCall.parameters());

		if (numStackArgs > 0) {
			assembler.add(Registers::SP, numStackArgs * Amd64Backend::REGISTER_SIZE);
		}

		if (!TypeSystem::isPrimitiveType(funcToCall.returnType(), PrimitiveTypes::Void)) {
			//Push the return value
			if (TypeSystem::isPrimitiveType(funcToCall.returnType(), PrimitiveTypes::Float)) {
				operandStack.pushReg(FloatRegisterCallArguments::ReturnValue);
			} else {
				operandStack.pushReg(RegisterCallArguments::ReturnValue);
			}
		}
	}